

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,phmap::Hash<cs::signal_types>,phmap::EqualTo<cs::signal_types>,std::allocator<cs::signal_types>>
::emplace_at<cs::signal_types_const&>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
           *this,size_t i,signal_types *args)

{
  allocator<cs::signal_types> *in_RDI;
  slot_type *in_stack_ffffffffffffffd8;
  
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
  ::alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::signal_types>,_phmap::Hash<cs::signal_types>,_phmap::EqualTo<cs::signal_types>,_std::allocator<cs::signal_types>_>
               *)0x152952);
  hash_policy_traits<phmap::priv::FlatHashSetPolicy<cs::signal_types>,void>::
  construct<std::allocator<cs::signal_types>,cs::signal_types_const&>
            (in_RDI,in_stack_ffffffffffffffd8,(signal_types *)0x152974);
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args)
			{
				PolicyTraits::construct(&alloc_ref(), slots_ + i,
				                        std::forward<Args>(args)...);

#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
				// this check can be costly, so do it only when requested
				assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
				       iterator_at(i) &&
				       "constructed value does not match the lookup key");
#endif
			}